

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoopSelSwitch<long,long,long,duckdb::BothInclusiveBetweenOperator,true>
                (UnifiedVectorFormat *adata,UnifiedVectorFormat *bdata,UnifiedVectorFormat *cdata,
                SelectionVector *sel,idx_t count,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  SelectionVector *pSVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  SelectionVector *pSVar5;
  data_ptr_t pdVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  sel_t *psVar10;
  sel_t *psVar11;
  sel_t *psVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  idx_t iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  
  pSVar1 = adata->sel;
  pdVar2 = adata->data;
  pSVar3 = bdata->sel;
  pdVar4 = bdata->data;
  pSVar5 = cdata->sel;
  pdVar6 = cdata->data;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar22 = 0;
      }
      else {
        psVar7 = sel->sel_vector;
        psVar8 = pSVar1->sel_vector;
        psVar9 = pSVar3->sel_vector;
        psVar10 = pSVar5->sel_vector;
        psVar11 = false_sel->sel_vector;
        lVar22 = 0;
        uVar20 = 0;
        do {
          uVar21 = uVar20;
          if (psVar7 != (sel_t *)0x0) {
            uVar21 = (ulong)psVar7[uVar20];
          }
          uVar17 = uVar20;
          if (psVar8 != (sel_t *)0x0) {
            uVar17 = (ulong)psVar8[uVar20];
          }
          uVar19 = uVar20;
          if (psVar9 != (sel_t *)0x0) {
            uVar19 = (ulong)psVar9[uVar20];
          }
          uVar18 = uVar20;
          if (psVar10 != (sel_t *)0x0) {
            uVar18 = (ulong)psVar10[uVar20];
          }
          lVar13 = *(long *)(pdVar2 + uVar17 * 8);
          lVar14 = *(long *)(pdVar4 + uVar19 * 8);
          lVar15 = *(long *)(pdVar6 + uVar18 * 8);
          psVar11[lVar22] = (sel_t)uVar21;
          lVar22 = lVar22 + (ulong)(lVar15 < lVar13 || lVar13 < lVar14);
          uVar20 = uVar20 + 1;
        } while (count != uVar20);
      }
      return count - lVar22;
    }
    if (count != 0) {
      psVar7 = sel->sel_vector;
      psVar8 = pSVar1->sel_vector;
      psVar9 = pSVar3->sel_vector;
      psVar10 = pSVar5->sel_vector;
      psVar11 = true_sel->sel_vector;
      iVar16 = 0;
      uVar20 = 0;
      do {
        uVar21 = uVar20;
        if (psVar7 != (sel_t *)0x0) {
          uVar21 = (ulong)psVar7[uVar20];
        }
        uVar17 = uVar20;
        if (psVar8 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar8[uVar20];
        }
        uVar19 = uVar20;
        if (psVar9 != (sel_t *)0x0) {
          uVar19 = (ulong)psVar9[uVar20];
        }
        uVar18 = uVar20;
        if (psVar10 != (sel_t *)0x0) {
          uVar18 = (ulong)psVar10[uVar20];
        }
        lVar22 = *(long *)(pdVar2 + uVar17 * 8);
        lVar13 = *(long *)(pdVar4 + uVar19 * 8);
        lVar14 = *(long *)(pdVar6 + uVar18 * 8);
        psVar11[iVar16] = (sel_t)uVar21;
        iVar16 = iVar16 + (lVar22 <= lVar14 && lVar13 <= lVar22);
        uVar20 = uVar20 + 1;
      } while (count != uVar20);
      return iVar16;
    }
  }
  else if (count != 0) {
    psVar7 = sel->sel_vector;
    psVar8 = pSVar1->sel_vector;
    psVar9 = pSVar3->sel_vector;
    psVar10 = pSVar5->sel_vector;
    psVar11 = true_sel->sel_vector;
    psVar12 = false_sel->sel_vector;
    iVar16 = 0;
    lVar22 = 0;
    uVar20 = 0;
    do {
      uVar21 = uVar20;
      if (psVar7 != (sel_t *)0x0) {
        uVar21 = (ulong)psVar7[uVar20];
      }
      uVar17 = uVar20;
      if (psVar8 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar8[uVar20];
      }
      uVar19 = uVar20;
      if (psVar9 != (sel_t *)0x0) {
        uVar19 = (ulong)psVar9[uVar20];
      }
      uVar18 = uVar20;
      if (psVar10 != (sel_t *)0x0) {
        uVar18 = (ulong)psVar10[uVar20];
      }
      lVar13 = *(long *)(pdVar2 + uVar17 * 8);
      lVar14 = *(long *)(pdVar4 + uVar19 * 8);
      lVar15 = *(long *)(pdVar6 + uVar18 * 8);
      psVar11[iVar16] = (sel_t)uVar21;
      iVar16 = iVar16 + (lVar13 <= lVar15 && lVar14 <= lVar13);
      psVar12[lVar22] = (sel_t)uVar21;
      lVar22 = lVar22 + (ulong)(lVar13 > lVar15 || lVar14 > lVar13);
      uVar20 = uVar20 + 1;
    } while (count != uVar20);
    return iVar16;
  }
  return 0;
}

Assistant:

static inline idx_t SelectLoopSelSwitch(UnifiedVectorFormat &adata, UnifiedVectorFormat &bdata,
	                                        UnifiedVectorFormat &cdata, const SelectionVector *sel, idx_t count,
	                                        SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, true, false>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectLoop<A_TYPE, B_TYPE, C_TYPE, OP, NO_NULL, false, true>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), sel, count, *adata.sel, *bdata.sel, *cdata.sel,
			    adata.validity, bdata.validity, cdata.validity, true_sel, false_sel);
		}
	}